

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-ast.c
# Opt level: O2

ztast_id_t * ztast_id(ztast_t *ast,char *name)

{
  size_t sVar1;
  void *__dest;
  ztast_id_t *pzVar2;
  
  sVar1 = strlen(name);
  __dest = (*ast->mallocfn)(sVar1 + 1,ast->opaque);
  if (__dest != (void *)0x0) {
    pzVar2 = (ztast_id_t *)memcpy(__dest,name,sVar1 + 1);
    return pzVar2;
  }
  return (ztast_id_t *)0x0;
}

Assistant:

ztast_id_t *ztast_id(ztast_t *ast, const char *name)
{
  size_t      namelen;
  ztast_id_t *id;

  assert(ast);
  assert(name);

#ifdef ZTAST_LOG
  if (ast->logfn)
    ast->logfn("ztast_id\n");
#endif

  namelen = strlen(name);
  id = ZTAST_MALLOC(offsetof(ztast_id_t, name) + namelen + 1);
  if (id == NULL)
    return NULL;

  memcpy(id->name, name, namelen + 1);

  return id;
}